

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<double>
          (BasicWriter<wchar_t> *this,double value,FormatSpec *spec)

{
  void *__src;
  long lVar1;
  Alignment AVar2;
  wchar_t wVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  wchar_t wVar9;
  CharPtr pwVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  wchar_t __tmp;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  wchar_t *buffer;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  wchar_t format [10];
  undefined4 in_stack_ffffffffffffff70;
  uint uVar31;
  undefined4 in_stack_ffffffffffffff74;
  wchar_t wVar32;
  wchar_t local_58;
  int local_54 [9];
  
  bVar21 = spec->type_;
  uVar12 = bVar21 - 0x41;
  if (uVar12 < 0x27) {
    if ((0x71UL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar12 & 0x3f) & 1) == 0) goto LAB_0010d0a7;
      goto LAB_0010cb36;
    }
    bVar23 = true;
  }
  else {
LAB_0010d0a7:
    if (bVar21 != 0) {
      internal::report_unknown_type
                ((char)((ulong)spec >> 0x38),
                 (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    bVar21 = 0x67;
LAB_0010cb36:
    bVar23 = false;
  }
  if (0.0 <= value) {
    if ((spec->flags_ & 1) == 0) {
      bVar16 = 0;
    }
    else {
      bVar16 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar16 = 0x20;
      }
    }
  }
  else {
    value = -value;
    bVar16 = 0x2d;
  }
  if (NAN(value)) {
    pcVar18 = " nan";
    if (bVar23) {
      pcVar18 = " NAN";
    }
    pcVar17 = " nan";
    if (bVar23) {
      pcVar17 = " NAN";
    }
    pcVar17 = pcVar17 + 1;
    if (bVar16 != 0) {
      pcVar17 = pcVar18;
    }
    uVar13 = (ulong)(bVar16 != 0);
LAB_0010cbc8:
    pwVar10 = write_str<char>(this,pcVar17,uVar13 + 3,&spec->super_AlignSpec);
    if (bVar16 != 0) {
      *pwVar10 = (uint)bVar16;
    }
    return;
  }
  if (ABS(value) == INFINITY) {
    pcVar18 = " inf";
    if (bVar23) {
      pcVar18 = " INF";
    }
    pcVar17 = " inf";
    if (bVar23) {
      pcVar17 = " INF";
    }
    uVar13 = (ulong)(bVar16 != 0);
    pcVar17 = pcVar17 + 1;
    if (bVar16 != 0) {
      pcVar17 = pcVar18;
    }
    goto LAB_0010cbc8;
  }
  puVar4 = *(undefined8 **)(this + 8);
  lVar20 = puVar4[2];
  uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (bVar16 != 0) {
    if ((ulong)puVar4[3] < (ulong)(uVar12 + (uVar12 == 0)) + lVar20) {
      (**(code **)*puVar4)();
    }
    bVar23 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar23) {
      uVar12 = 0;
    }
    lVar20 = lVar20 + 1;
  }
  local_58 = L'%';
  if ((spec->flags_ & 8) == 0) {
    piVar11 = local_54;
  }
  else {
    piVar11 = local_54 + 1;
    local_54[0] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_0010cc81:
    uVar12 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *piVar11 = 0x2d;
      piVar11 = piVar11 + 1;
    }
    if (uVar12 == 0) goto LAB_0010cc81;
    *piVar11 = 0x2a;
    piVar11 = piVar11 + 1;
  }
  if (-1 < spec->precision_) {
    piVar11[0] = 0x2e;
    piVar11[1] = 0x2a;
    piVar11 = piVar11 + 2;
  }
  *piVar11 = (int)(char)bVar21;
  piVar11[1] = 0;
  wVar32 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  uVar31 = 0;
  do {
    buffer = (wchar_t *)(*(long *)(*(long *)(this + 8) + 8) + lVar20 * 4);
    uVar8 = internal::CharTraits<wchar_t>::format_float<double>
                      (buffer,*(long *)(*(long *)(this + 8) + 0x18) - lVar20,&local_58,uVar12,
                       spec->precision_,value);
    if ((int)uVar8 < 0) {
      puVar4 = *(undefined8 **)(this + 8);
      bVar23 = true;
      uVar8 = uVar31;
      if (puVar4[3] != -1) {
        (**(code **)*puVar4)(puVar4,puVar4[3] + 1);
        uVar8 = uVar31;
      }
    }
    else {
      uVar13 = (*(undefined8 **)(this + 8))[3];
      if ((ulong)uVar8 + lVar20 < uVar13) {
        bVar23 = false;
      }
      else {
        bVar23 = true;
        if (uVar13 < (ulong)uVar8 + lVar20 + 1) {
          (**(code **)**(undefined8 **)(this + 8))();
        }
      }
    }
    uVar31 = uVar8;
  } while (bVar23);
  if (bVar16 == 0) {
    bVar16 = 0;
    goto LAB_0010cdca;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    wVar3 = *buffer;
joined_r0x0010cdb8:
    wVar9 = wVar32;
    if (wVar3 != L' ') goto LAB_0010cdbe;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      wVar3 = *buffer;
      goto joined_r0x0010cdb8;
    }
LAB_0010cdbe:
    wVar9 = (wchar_t)bVar16;
    bVar16 = 0;
  }
  buffer[-1] = wVar9;
  uVar8 = uVar8 + 1;
LAB_0010cdca:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar8 < uVar12) {
      puVar4 = *(undefined8 **)(this + 8);
      lVar20 = puVar4[2];
      uVar13 = lVar20 + (ulong)uVar12;
      if ((ulong)puVar4[3] < uVar13) {
        (**(code **)*puVar4)(puVar4,uVar13);
      }
      puVar4[2] = uVar13;
      lVar14 = *(long *)(*(long *)(this + 8) + 8);
      __src = (void *)(lVar14 + lVar20 * 4);
      uVar22 = (ulong)uVar8;
      memmove((void *)((long)__src + (ulong)(uVar12 - uVar8 >> 1) * 4),__src,uVar22 * 4);
      auVar7 = _DAT_0010f130;
      auVar6 = _DAT_0010f120;
      auVar5 = _DAT_0010f110;
      uVar12 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar15 = uVar12 - uVar22;
      uVar13 = uVar15 >> 1;
      if (1 < uVar15) {
        uVar15 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar15;
        auVar24._0_8_ = uVar15;
        auVar24._12_4_ = (int)(uVar15 >> 0x20);
        lVar1 = lVar14 + lVar20 * 4;
        lVar19 = 0;
        auVar24 = auVar24 ^ _DAT_0010f130;
        do {
          auVar27._8_4_ = (int)lVar19;
          auVar27._0_8_ = lVar19;
          auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
          auVar29 = (auVar27 | auVar6) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar26 && auVar24._0_4_ < auVar29._0_4_ ||
                      iVar26 < auVar29._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar19 * 4) = wVar32;
          }
          if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
              auVar29._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar19 * 4) = wVar32;
          }
          auVar27 = (auVar27 | auVar5) ^ auVar7;
          iVar30 = auVar27._4_4_;
          if (iVar30 <= iVar26 && (iVar30 != iVar26 || auVar27._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar19 * 4) = wVar32;
            *(wchar_t *)(lVar1 + 0xc + lVar19 * 4) = wVar32;
          }
          lVar19 = lVar19 + 4;
        } while ((uVar15 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar19);
      }
      auVar7 = _DAT_0010f130;
      auVar6 = _DAT_0010f120;
      auVar5 = _DAT_0010f110;
      if (uVar12 == uVar8) {
        return;
      }
      uVar15 = ((ulong)uVar12 * 4 + (uVar13 + uVar22) * -4) - 4;
      auVar29._8_4_ = (int)uVar15;
      auVar29._0_8_ = uVar15;
      auVar29._12_4_ = (int)(uVar15 >> 0x20);
      auVar25._0_8_ = uVar15 >> 2;
      auVar25._8_8_ = auVar29._8_8_ >> 2;
      lVar14 = uVar13 * 4 + lVar20 * 4 + uVar22 * 4 + lVar14;
      uVar13 = 0;
      auVar25 = auVar25 ^ _DAT_0010f130;
      do {
        auVar28._8_4_ = (int)uVar13;
        auVar28._0_8_ = uVar13;
        auVar28._12_4_ = (int)(uVar13 >> 0x20);
        auVar24 = (auVar28 | auVar6) ^ auVar7;
        iVar26 = auVar25._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar26 && auVar25._0_4_ < auVar24._0_4_ ||
                    iVar26 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar14 + uVar13 * 4) = wVar32;
        }
        if ((auVar24._12_4_ != auVar25._12_4_ || auVar24._8_4_ <= auVar25._8_4_) &&
            auVar24._12_4_ <= auVar25._12_4_) {
          *(wchar_t *)(lVar14 + 4 + uVar13 * 4) = wVar32;
        }
        auVar24 = (auVar28 | auVar5) ^ auVar7;
        iVar30 = auVar24._4_4_;
        if (iVar30 <= iVar26 && (iVar30 != iVar26 || auVar24._0_4_ <= auVar25._0_4_)) {
          *(wchar_t *)(lVar14 + 8 + uVar13 * 4) = wVar32;
          *(wchar_t *)(lVar14 + 0xc + uVar13 * 4) = wVar32;
        }
        uVar13 = uVar13 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar13);
      return;
    }
  }
  if ((bVar16 != 0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    wVar3 = *buffer;
    while (wVar3 == L' ') {
      *buffer = wVar32;
      wVar3 = buffer[1];
      buffer = buffer + 1;
    }
    if (bVar16 != 0) {
      buffer[-1] = (uint)bVar16;
    }
  }
  puVar4 = *(undefined8 **)(this + 8);
  uVar13 = (ulong)uVar8 + puVar4[2];
  if ((ulong)puVar4[3] < uVar13) {
    (**(code **)*puVar4)(puVar4,uVar13);
  }
  puVar4[2] = uVar13;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}